

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcmain3.c
# Opt level: O3

LispPTR gcmapscan(void)

{
  LispPTR *pLVar1;
  LispPTR *pLVar2;
  int probe;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  uint *puVar6;
  LispPTR LVar7;
  
  probe = gcscan1(0x8000);
  pLVar2 = HTmain;
  do {
    if (probe == -1) {
      HTmain = pLVar2;
      return 0;
    }
    LVar7 = pLVar2[probe];
    HTmain = pLVar2;
    while ((LVar7 & 1) != 0) {
      puVar6 = HTcoll + (LVar7 & 0xfffffffe);
      uVar3 = *puVar6;
      if (uVar3 < 0x10000) {
        pLVar2[probe] = puVar6[1] | 1;
      }
      else {
        do {
          puVar4 = puVar6;
          uVar5 = (ulong)puVar4[1];
          if (uVar5 == 0) goto LAB_001245d2;
          puVar6 = HTcoll + uVar5;
          uVar3 = *puVar6;
        } while (0xffff < uVar3);
        puVar4[1] = puVar6[1];
      }
      *puVar6 = 0;
      puVar6[1] = *HTcoll;
      *HTcoll = (LispPTR)((ulong)((long)puVar6 - (long)HTcoll) >> 2);
      if (HTcoll[(ulong)(pLVar2[probe] & 0xfffffffe) + 1] == 0) {
        pLVar1 = HTcoll + (pLVar2[probe] & 0xfffffffe);
        pLVar2[probe] = *pLVar1;
        *pLVar1 = 0;
        pLVar1[1] = *HTcoll;
        *HTcoll = (LispPTR)((ulong)((long)pLVar1 - (long)HTcoll) >> 2);
      }
      for (uVar3 = gcreccell((uVar3 & 0xfffe) << 0xf | probe * 2); uVar3 != 0;
          uVar3 = gcreccell(uVar3)) {
        if ((-1 < *(short *)((ulong)(uVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
           (*GcDisabled_word != 0x4c)) {
          rec_htfind(uVar3,0);
        }
      }
      LVar7 = pLVar2[probe];
      if (LVar7 == 0) goto LAB_001245d2;
    }
    if (LVar7 < 0x10000) {
      pLVar2[probe] = 0;
      for (uVar3 = gcreccell(LVar7 << 0xf | probe * 2); uVar3 != 0; uVar3 = gcreccell(uVar3)) {
        if ((-1 < *(short *)((ulong)(uVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
           (*GcDisabled_word != 0x4c)) {
          rec_htfind(uVar3,0);
        }
      }
    }
LAB_001245d2:
    probe = gcscan1(probe);
    pLVar2 = HTmain;
  } while( true );
}

Assistant:

LispPTR gcmapscan(void) {
  int probe;
  GCENTRY *entry;
  GCENTRY offset, dbgcontents;
  LispPTR ptr;

  probe = HTMAIN_ENTRY_COUNT;
nextentry:
  while ((probe = gcscan1(probe)) != -1) {
    entry = (GCENTRY *)HTmain + probe;
  retry:
    if (HENTRY->collision) {
      GCENTRY *prev;
      GCENTRY *link;
      LispPTR content;

      prev = (GCENTRY *)0;
      link = (GCENTRY *)HTcoll + GetLinkptr((content = HTLPTR->contents));
    linkloop:
      offset = ((struct htcoll *)link)->free_ptr;
      if (StkCntIsZero(offset)) {
        /* Reclaimable object */
        ptr = VAG2(GetSegnuminColl(offset), (probe << 1));
        DelLink(link, prev, entry);
        GcreclaimLp(ptr);
        if (HTLPTR->contents == 0)
          goto nextentry;
        else
          goto retry;
      }
      if ((offset = ((struct htcoll *)link)->next_free)) {
        prev = link;
        link = (GCENTRY *)(HTcoll + offset);
        goto linkloop;
      }
      goto nextentry;
    }
    if (StkCntIsZero(dbgcontents = HTLPTR->contents)) {
      ptr = VAG2(HENTRY->segnum, (probe << 1));
      HTLPTR->contents = 0;
      GcreclaimLp(ptr);
    }
  }
  return (NIL);
}